

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O0

string_view __thiscall cinatra::http_parser::get_boundary(http_parser *this)

{
  string_view sVar1;
  size_type sVar2;
  size_t in_RDI;
  string_view sVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  size_t pos;
  string_view content_type;
  char *in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  http_parser *in_stack_ffffffffffffffd8;
  char *in_stack_fffffffffffffff0;
  undefined8 local_8;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  sVar3._M_str = in_stack_fffffffffffffff0;
  sVar3._M_len = in_RDI;
  sVar3 = get_header_value(in_stack_ffffffffffffffd8,sVar3);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)sVar3._M_str,
                     (char *)sVar3._M_len,(size_type)in_stack_ffffffffffffffd0);
  if (sVar2 == 0xffffffffffffffff) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)sVar3._M_str,sVar3._M_len
                       ,(size_type)in_stack_ffffffffffffffd0);
    in_stack_fffffffffffffff0 = (char *)bVar4._M_len;
    local_8 = bVar4._M_str;
  }
  sVar1._M_str = local_8;
  sVar1._M_len = (size_t)in_stack_fffffffffffffff0;
  return sVar1;
}

Assistant:

std::string_view get_boundary() {
    auto content_type = get_header_value("Content-Type");
    size_t pos = content_type.find("=--");
    if (pos == std::string_view::npos) {
      return "";
    }

    return content_type.substr(pos + 1);
  }